

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink.h
# Opt level: O2

void __thiscall
spdlog::sinks::rotating_file_sink<std::mutex>::rotating_file_sink
          (rotating_file_sink<std::mutex> *this,filename_t *base_filename,size_t max_size,
          size_t max_files)

{
  size_t sVar1;
  filename_t fStack_48;
  
  base_sink<std::mutex>::base_sink(&this->super_base_sink<std::mutex>);
  (this->super_base_sink<std::mutex>).super_sink._vptr_sink =
       (_func_int **)&PTR__rotating_file_sink_00209a10;
  std::__cxx11::string::string((string *)&this->base_filename_,(string *)base_filename);
  this->max_size_ = max_size;
  this->max_files_ = max_files;
  (this->file_helper_).open_tries = 5;
  (this->file_helper_).open_interval = 10;
  (this->file_helper_).fd_ = (FILE *)0x0;
  (this->file_helper_)._filename._M_dataplus._M_p = (pointer)&(this->file_helper_)._filename.field_2
  ;
  (this->file_helper_)._filename._M_string_length = 0;
  (this->file_helper_)._filename.field_2._M_local_buf[0] = '\0';
  calc_filename(&fStack_48,&this->base_filename_,0);
  details::file_helper::open(&this->file_helper_,(char *)&fStack_48,0);
  std::__cxx11::string::~string((string *)&fStack_48);
  sVar1 = details::file_helper::size(&this->file_helper_);
  this->current_size_ = sVar1;
  return;
}

Assistant:

rotating_file_sink(filename_t base_filename, std::size_t max_size, std::size_t max_files)
        : base_filename_(std::move(base_filename))
        , max_size_(max_size)
        , max_files_(max_files)
    {
        file_helper_.open(calc_filename(base_filename_, 0));
        current_size_ = file_helper_.size(); // expensive. called only once
    }